

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O2

void __thiscall Buffer::Members::~Members(Members *this)

{
  if ((this->own_memory == true) && (this->buf != (uchar *)0x0)) {
    operator_delete__(this->buf);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Buffer::Members::~Members()
{
    if (this->own_memory) {
        delete[] this->buf;
    }
}